

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMK.cpp
# Opt level: O1

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::DMK::get_track_at_position(DMK *this,Address address)

{
  FileHolder *this_00;
  byte bVar1;
  FILE FVar2;
  ushort uVar3;
  DiskImage DVar4;
  Address AVar5;
  undefined8 uVar6;
  DMK *pDVar7;
  uint16_t uVar8;
  undefined8 in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  pointer __old_p_1;
  DiskImage DVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  pointer __old_p;
  shared_ptr<Storage::Disk::Track> sVar19;
  uint8_t header [6];
  vector<unsigned_char,_std::allocator<unsigned_char>_> track;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> segments;
  uint16_t idam_locations [64];
  byte local_12a;
  undefined1 local_129;
  DiskImage local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  Address local_118;
  long local_110;
  ulong local_108;
  FILE *local_100;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  __dev_t local_d8;
  DMK *local_c8;
  long local_c0;
  uint16_t auStack_b8 [68];
  
  this_00 = (FileHolder *)((long)address + 8);
  lVar15 = 0;
  local_118 = address;
  FileHolder::seek(this_00,(long)((int)((long)in_RDX >> 0x22) +
                                 *(int *)((long)address + 0xf8) * (int)in_RDX) *
                           *(long *)((long)address + 0x100) + 0x10,0);
  lVar11 = 0x40;
  do {
    uVar8 = FileHolder::get16le(this_00);
    AVar5 = local_118;
    auStack_b8[lVar15] = uVar8;
    lVar15 = (lVar15 + 1) - (ulong)((uVar8 & 0x7f80) == 0);
    lVar11 = lVar11 + -1;
  } while (lVar11 != 0);
  FileHolder::read((FileHolder *)&local_100,(int)this_00,
                   (void *)(*(long *)((long)local_118 + 0x100) + -0x80),(size_t)address);
  local_12a = *(byte *)((long)AVar5 + 0x108);
  local_e8._M_allocated_capacity = 0;
  local_e8._8_8_ = 0;
  local_d8 = 0;
  std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::emplace_back<>
            ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
             &local_e8);
  local_12a = local_12a ^ 1;
  local_c8 = this;
  anon_unknown.dwarf_120f0ee::new_encoder
            ((anon_unknown_dwarf_120f0ee *)&local_128,(PCMSegment *)(local_e8._8_8_ + -0x58),
             (bool)local_12a);
  uVar12 = *(long *)((long)local_118 + 0x100) - 0x80;
  lVar11 = 0;
  uVar18 = 0;
  DVar13._vptr_DiskImage = local_128._vptr_DiskImage;
  local_108 = uVar12;
  local_c0 = lVar15;
  do {
    if (uVar12 <= uVar18) break;
    uVar16 = uVar12;
    if (lVar11 != lVar15) {
      uVar16 = (ulong)(auStack_b8[lVar11] & 0x7fff) - 0x80;
    }
    local_110 = lVar11;
    if (((local_12a & 1) == 0) && (*(char *)((long)local_118 + 0x108) == '\0')) {
      std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
      emplace_back<>((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                      *)&local_e8);
      uVar6 = local_e8._8_8_;
      Encodings::MFM::GetMFMEncoder
                ((MFM *)&local_128,(vector<bool,_std::allocator<bool>_> *)(local_e8._8_8_ + -0x50),
                 (vector<bool,_std::allocator<bool>_> *)0x0);
      DVar4._vptr_DiskImage = local_128._vptr_DiskImage;
      *(undefined8 *)(uVar6 + -0x58) = 0x186a000000001;
      if (DVar13._vptr_DiskImage != (_func_int **)0x0) {
        (**(code **)(*DVar13._vptr_DiskImage + 8))(DVar13._vptr_DiskImage);
      }
      local_12a = 1;
      uVar12 = local_108;
      DVar13._vptr_DiskImage = DVar4._vptr_DiskImage;
    }
    lVar11 = local_110;
    uVar17 = uVar18;
    if (uVar18 < uVar16) {
      do {
        (**(code **)(*DVar13._vptr_DiskImage + 0x18))
                  (DVar13._vptr_DiskImage,(ulong)(byte)local_100[uVar17],0);
        uVar17 = uVar17 + 1;
        uVar18 = uVar16;
      } while (uVar16 != uVar17);
    }
    if (uVar16 != uVar12) {
      uVar3 = auStack_b8[lVar11];
      if (uVar3 >> 0xf != (ushort)(local_12a & 1)) {
        std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
        emplace_back<>((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                        *)&local_e8);
        local_12a = (byte)(uVar3 >> 8);
        anon_unknown.dwarf_120f0ee::new_encoder
                  ((anon_unknown_dwarf_120f0ee *)&local_128,(PCMSegment *)(local_e8._8_8_ + -0x58),
                   (bool)(local_12a >> 7));
        DVar4._vptr_DiskImage = local_128._vptr_DiskImage;
        local_128._vptr_DiskImage = (_func_int **)0x0;
        if (DVar13._vptr_DiskImage != (_func_int **)0x0) {
          (**(code **)(*DVar13._vptr_DiskImage + 8))(DVar13._vptr_DiskImage);
        }
        if (local_128._vptr_DiskImage != (_func_int **)0x0) {
          (**(code **)(*local_128._vptr_DiskImage + 8))();
        }
        local_12a = local_12a >> 7;
        DVar13._vptr_DiskImage = DVar4._vptr_DiskImage;
      }
      bVar1 = *(byte *)((long)local_118 + 0x108);
      (**(code **)(*DVar13._vptr_DiskImage + 0x28))(DVar13._vptr_DiskImage);
      lVar14 = 2 - (ulong)((bVar1 | local_12a) & 1);
      lVar15 = uVar18 + lVar14;
      lVar11 = 0;
      uVar12 = lVar14 * 3 + uVar18;
      do {
        uVar18 = uVar12;
        (**(code **)(*DVar13._vptr_DiskImage + 0x18))
                  (DVar13._vptr_DiskImage,(ulong)(byte)local_100[lVar15],0);
        *(FILE *)((long)&local_128._vptr_DiskImage + lVar11) = local_100[lVar15];
        lVar11 = lVar11 + 1;
        lVar15 = lVar15 + lVar14;
        uVar12 = uVar18 + lVar14;
      } while (lVar11 != 6);
      while( true ) {
        FVar2 = local_100[lVar15];
        if (FVar2 == (FILE)0xfb) break;
        if (FVar2 == (FILE)0xf8) {
          lVar15 = 0x38;
          goto LAB_00436d80;
        }
        lVar15 = lVar15 + lVar14;
        uVar18 = uVar18 + lVar14;
        (**(code **)(*DVar13._vptr_DiskImage + 0x18))(DVar13._vptr_DiskImage,(ulong)(byte)FVar2,0);
      }
      lVar15 = 0x30;
LAB_00436d80:
      (**(code **)(*DVar13._vptr_DiskImage + lVar15))(DVar13._vptr_DiskImage);
      lVar15 = local_c0;
      (**(code **)(*DVar13._vptr_DiskImage + 0x30))(DVar13._vptr_DiskImage);
      uVar10 = 0x80 << (local_128._vptr_DiskImage._3_1_ & 0x1f) | 2;
      do {
        (**(code **)(*DVar13._vptr_DiskImage + 0x18))
                  (DVar13._vptr_DiskImage,(ulong)(byte)local_100[uVar18],0);
        uVar18 = uVar18 + lVar14;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
      lVar11 = local_110 + 1;
      uVar12 = local_108;
    }
  } while (uVar16 != uVar12);
  local_128._vptr_DiskImage = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,std::vector<Storage::Disk::PCMSegment,std::allocator<Storage::Disk::PCMSegment>>&>
            (&local_120,(PCMTrack **)&local_128,(allocator<Storage::Disk::PCMTrack> *)&local_129,
             (vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
             &local_e8);
  pDVar7 = local_c8;
  _Var9._M_pi = local_120._M_pi;
  (local_c8->super_DiskImage)._vptr_DiskImage = local_128._vptr_DiskImage;
  (local_c8->file_).file_ = (FILE *)0x0;
  local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_c8->file_).file_ = (FILE *)_Var9._M_pi;
  if (DVar13._vptr_DiskImage != (_func_int **)0x0) {
    (**(code **)(*DVar13._vptr_DiskImage + 8))(DVar13._vptr_DiskImage);
  }
  std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::~vector
            ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
             &local_e8);
  _Var9._M_pi = extraout_RDX;
  if (local_100 != (FILE *)0x0) {
    operator_delete(local_100,local_f0 - (long)local_100);
    _Var9._M_pi = extraout_RDX_00;
  }
  sVar19.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  sVar19.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pDVar7;
  return (shared_ptr<Storage::Disk::Track>)
         sVar19.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<::Storage::Disk::Track> DMK::get_track_at_position(::Storage::Disk::Track::Address address) {
	file_.seek(get_file_offset_for_position(address), SEEK_SET);

	// Read the IDAM table.
	uint16_t idam_locations[64];
	std::size_t idam_count = 0;
	for(std::size_t c = 0; c < sizeof(idam_locations) / sizeof(*idam_locations); ++c) {
		idam_locations[idam_count] = file_.get16le();
		if((idam_locations[idam_count] & 0x7fff) >= 128) {
			idam_count++;
		}
	}

	// Grab the rest of the track.
	std::vector<uint8_t> track = file_.read(size_t(track_length_ - 0x80));

	// Default to outputting double density unless the disk doesn't support it.
	bool is_double_density = !is_purely_single_density_;
	std::vector<PCMSegment> segments;
	std::unique_ptr<Encodings::MFM::Encoder> encoder;
	segments.emplace_back();
	encoder = new_encoder(segments.back(), is_double_density);

	std::size_t idam_pointer = 0;

	const std::size_t track_length = size_t(track_length_) - 0x80;
	std::size_t track_pointer = 0;
	while(track_pointer < track_length) {
		// Determine bytes left until next IDAM.
		std::size_t destination;
		if(idam_pointer != idam_count) {
			destination = (idam_locations[idam_pointer] & 0x7fff) - 0x80;
		} else {
			destination = track_length;
		}

		// Output every intermediate byte.
		if(!is_double_density && !is_purely_single_density_) {
			is_double_density = true;
			segments.emplace_back();
			encoder = new_encoder(segments.back(), is_double_density);
		}
		while(track_pointer < destination) {
			encoder->add_byte(track[track_pointer]);
			track_pointer++;
		}

		// Exit now if that's it.
		if(destination == track_length) break;

		// Being now located at the IDAM, check for a change of encoding.
		bool next_is_double_density = !!(idam_locations[idam_pointer] & 0x8000);
		if(next_is_double_density != is_double_density) {
			is_double_density = next_is_double_density;
			segments.emplace_back();
			encoder = new_encoder(segments.back(), is_double_density);
		}

		// Now at the IDAM, which will always be an FE regardless of FM/MFM encoding,
		// presumably through misunderstanding of the designer? Write out a real IDAM
		// for the current density, then the rest of the ID: four bytes for the address
		// plus two for the CRC. Keep a copy of the header while we're here, so that the
		// size of the sector is known momentarily.
		std::size_t step_rate = (!is_double_density && !is_purely_single_density_) ? 2 : 1;
		encoder->add_ID_address_mark();
		uint8_t header[6];
		for(int c = 0; c < 6; ++c) {
			track_pointer += step_rate;
			encoder->add_byte(track[track_pointer]);
			header[c] = track[track_pointer];
		}
		track_pointer += step_rate;

		// Now write out as many bytes as are found prior to an FB or F8 (same comment as
		// above: those are the FM-esque marks, but it seems as though transcription to MFM
		// is implicit).
		while(true) {
			uint8_t next_byte = track[track_pointer];
			track_pointer += step_rate;
			if(next_byte == 0xfb || next_byte == 0xf8) {
				// Write a data or deleted data address mark.
				if(next_byte == 0xfb) encoder->add_data_address_mark();
				else encoder->add_deleted_data_address_mark();
				break;
			}
			encoder->add_byte(next_byte);
		}

		// Now write out a data mark (the file format appears to leave these implicit?),
		// then the sector contents plus the CRC.
		encoder->add_data_address_mark();
		int sector_size = 2 + (128 << header[3]);
		while(sector_size--) {
			encoder->add_byte(track[track_pointer]);
			track_pointer += step_rate;
		}

		idam_pointer++;
	}

	return std::make_shared<PCMTrack>(segments);
}